

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O1

GeneralizedMAAStarPlannerForDecPOMDPDiscrete *
GetGMAAInstance(DecPOMDPDiscreteInterface *decpomdp,Arguments *args,
               PlanningUnitMADPDiscreteParameters *params,string *filename,
               BGIP_SolverCreatorInterface *bgipsc_p)

{
  int iVar1;
  pointer pcVar2;
  double dVar3;
  int iVar4;
  GMAA_kGMAACluster *this;
  ostream *poVar5;
  E *this_00;
  string bgFilename;
  long *local_58;
  long local_50;
  long local_48 [2];
  string *local_38;
  
  iVar1 = args->verbose;
  local_38 = filename;
  if (args->useBGclustering == 0) {
    switch(args->gmaa) {
    case MAAstar:
      iVar4 = (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[5])(bgipsc_p);
      if ((char)iVar4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: MAAstar requires an exact BG solver, and ",0x30);
        (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[4])(&local_58,bgipsc_p);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_58,local_50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not",7);
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_001147e6;
      }
      this = (GMAA_kGMAACluster *)operator_new(0x448);
      GMAA_MAAstar::GMAA_MAAstar
                ((GMAA_MAAstar *)this,bgipsc_p,(long)args->horizon,decpomdp,params,iVar1);
      break;
    case FSPC:
      args->k = 1;
    case kGMAA:
      this = (GMAA_kGMAACluster *)operator_new(0x448);
      GMAA_kGMAA::GMAA_kGMAA
                ((GMAA_kGMAA *)this,bgipsc_p,(long)args->horizon,decpomdp,params,(long)args->k);
      break;
    case MAAstarClassic:
      this = (GMAA_kGMAACluster *)operator_new(0x440);
      GMAA_MAAstarClassic::GMAA_MAAstarClassic
                ((GMAA_MAAstarClassic *)this,(long)args->horizon,decpomdp,params,iVar1);
      break;
    default:
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"unrecognized GMAA type?!");
      goto LAB_00114775;
    }
    goto LAB_00114617;
  }
  switch(args->gmaa) {
  case MAAstar:
    iVar4 = (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[5])(bgipsc_p);
    if ((char)iVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: MAAstar requires an exact BG solver, and ",0x30);
      (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[4])(&local_58,bgipsc_p);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not",7);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_001147e6:
      std::__cxx11::string::~string((string *)&local_58);
      exit(1);
    }
    this = (GMAA_kGMAACluster *)operator_new(0x490);
    GMAA_MAAstarCluster::GMAA_MAAstarCluster
              ((GMAA_MAAstarCluster *)this,bgipsc_p,(long)args->horizon,decpomdp,params,iVar1);
    break;
  case FSPC:
    args->k = 1;
  case kGMAA:
    this = (GMAA_kGMAACluster *)operator_new(0x4c0);
    GMAA_kGMAACluster::GMAA_kGMAACluster
              (this,bgipsc_p,(long)args->horizon,decpomdp,params,(long)args->k,
               args->BGClusterAlgorithm);
    dVar3 = args->thresholdPjaoh;
    *(double *)(this + 0x4a0) = args->thresholdJB;
    *(double *)(this + 0x4a8) = dVar3;
    break;
  case MAAstarClassic:
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"MAAstarClassic not implemented for clustered version");
    goto LAB_00114775;
  default:
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"unrecognized GMAA type?!");
LAB_00114775:
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
LAB_00114617:
  if ((args->dryrun == 0) && (args->saveAllBGs != 0)) {
    pcVar2 = (local_38->_M_dataplus)._M_p;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + local_38->_M_string_length);
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_assign((string *)((GMAA_MAAstarCluster *)this + 0x3b8));
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  GeneralizedMAAStarPlanner::SetVerbose((int)((GMAA_MAAstarCluster *)this + 0x338));
  if (args->GMAAdeadline != 0) {
    GeneralizedMAAStarPlanner::SetDeadline((ulong)((GMAA_MAAstarCluster *)this + 0x338));
  }
  return (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)this;
}

Assistant:

GeneralizedMAAStarPlannerForDecPOMDPDiscrete* GetGMAAInstance(
    DecPOMDPDiscreteInterface* decpomdp,
    ArgumentHandlers::Arguments &args,
    const PlanningUnitMADPDiscreteParameters &params,
    const string &filename,
    BGIP_SolverCreatorInterface * bgipsc_p
    )
{
    GeneralizedMAAStarPlannerForDecPOMDPDiscrete *gmaa=0;

    int verboseness = args.verbose;
    if(args.useBGclustering)
    {
        switch(args.gmaa)
        {
        case MAAstar:
            if(!bgipsc_p->IsExactSolver())
            {
                cout << "Error: MAAstar requires an exact BG solver, and " <<
                    bgipsc_p->SoftPrintBrief() << " is not" << endl;
                exit(1);
            }
            gmaa=new GMAA_MAAstarCluster(bgipsc_p, args.horizon, decpomdp, &params, verboseness );
            break;
        case FSPC:
            args.k=1; // fall through on purpose
        case kGMAA:
        {
            GMAA_kGMAACluster *gmaaCluster=
                new GMAA_kGMAACluster(bgipsc_p, args.horizon, decpomdp, &params, args.k,
                                      static_cast<BayesianGameWithClusterInfo::BGClusterAlgorithm>(args.BGClusterAlgorithm));
            gmaaCluster->SetTresholdJB(args.thresholdJB);
            gmaaCluster->SetTresholdPjaoh(args.thresholdPjaoh);
            gmaa=gmaaCluster;
            break;
        }
        case MAAstarClassic:
            throw E("MAAstarClassic not implemented for clustered version");
            break;
        default:
            throw E("unrecognized GMAA type?!");
        }
    }
    else // regular, un-clustered BGs
    {
        switch(args.gmaa)
        {
        case MAAstar:
            if(!bgipsc_p->IsExactSolver())
            {
                cout << "Error: MAAstar requires an exact BG solver, and " <<
                    bgipsc_p->SoftPrintBrief() << " is not" << endl;
                exit(1);
            }
            gmaa=new GMAA_MAAstar(bgipsc_p, args.horizon, decpomdp, &params, verboseness );
            break;
        case FSPC:
            args.k=1; // fall through on purpose
        case kGMAA:
            gmaa=new GMAA_kGMAA(bgipsc_p, args.horizon, decpomdp, &params, args.k);
            break;
        case MAAstarClassic:
            gmaa=new GMAA_MAAstarClassic(args.horizon, decpomdp, &params, verboseness );
            break;
        default:
            throw E("unrecognized GMAA type?!");
        }
    }

    if(!args.dryrun)
    {
#if 0 // don't store this stuff every iteration, the files can get
      // very large and will slow down the execution!
        // instead we do it when an exception is thrown (but might not
        // work when running out of memory)
        if(args.saveTimings)
            gmaa->SetIntermediateTimingFilename(timingsFilename);
        if(dynamic_cast<GMAA_MAAstarCluster*>(gmaa))
            static_cast<GMAA_MAAstarCluster*>(gmaa)->
                SetClusterStatsFilename(filename + "_clusterStats");

#endif
        if(args.saveAllBGs)
        {
            string bgFilename=filename + "_BG";
            gmaa->SetSaveAllBGs(bgFilename);
        }
    }
    
    gmaa->SetVerbose(args.verbose);
    if(args.GMAAdeadline)
        gmaa->SetDeadline(args.GMAAdeadline);

    return(gmaa);
}